

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O2

void __thiscall
google::protobuf::DescriptorBuilder::BuildMessage
          (DescriptorBuilder *this,DescriptorProto *proto,Descriptor *parent,Descriptor *result)

{
  RepeatedPtrField<google::protobuf::DescriptorProto_ExtensionRange> *this_00;
  Descriptor *output;
  ExtensionRange *pEVar1;
  ExtensionRange *pEVar2;
  Symbol symbol;
  int iVar3;
  Descriptor *pDVar4;
  string *psVar5;
  string *psVar6;
  Type *pTVar7;
  Type *proto_00;
  Type *proto_01;
  Type *pTVar8;
  long lVar9;
  FieldDescriptor *pFVar10;
  MessageOptions *orig_options;
  int i_4;
  SubstituteArg *pSVar11;
  int i_3;
  int i;
  long lVar12;
  anon_union_8_7_bfa3a334_for_Symbol_2 aVar13;
  SubstituteArg *arg9;
  long local_258;
  undefined4 uStack_23c;
  string local_230;
  SubstituteArg local_210;
  SubstituteArg local_1e0;
  SubstituteArg local_1b0;
  SubstituteArg local_180;
  SubstituteArg local_150;
  SubstituteArg local_120;
  SubstituteArg local_f0;
  SubstituteArg local_c0;
  SubstituteArg local_90;
  SubstituteArg local_60;
  
  pDVar4 = parent;
  if (parent == (Descriptor *)0x0) {
    pDVar4 = (Descriptor *)this->file_;
  }
  psVar5 = DescriptorPool::Tables::AllocateString(this->tables_,*(string **)(pDVar4 + 8));
  if (psVar5->_M_string_length != 0) {
    std::__cxx11::string::append((ulong)psVar5,'\x01');
  }
  local_258 = 1;
  std::__cxx11::string::append((string *)psVar5);
  ValidateSymbolName(this,proto->name_,psVar5,&proto->super_Message);
  psVar6 = DescriptorPool::Tables::AllocateString(this->tables_,proto->name_);
  *(string **)result = psVar6;
  *(string **)(result + 8) = psVar5;
  *(FileDescriptor **)(result + 0x10) = this->file_;
  *(Descriptor **)(result + 0x18) = parent;
  *(undefined2 *)(result + 0x28) = 0;
  iVar3 = (proto->field_).super_RepeatedPtrFieldBase.current_size_;
  *(int *)(result + 0x2c) = iVar3;
  pDVar4 = result + 0x30;
  AllocateArray<google::protobuf::FieldDescriptor>(this,iVar3,(FieldDescriptor **)pDVar4);
  lVar9 = 0;
  for (lVar12 = 0; lVar12 < (proto->field_).super_RepeatedPtrFieldBase.current_size_;
      lVar12 = lVar12 + 1) {
    pTVar7 = internal::RepeatedPtrFieldBase::
             Get<google::protobuf::RepeatedPtrField<google::protobuf::FieldDescriptorProto>::TypeHandler>
                       (&(proto->field_).super_RepeatedPtrFieldBase,(int)lVar12);
    BuildField(this,pTVar7,result,(FieldDescriptor *)(*(long *)(result + 0x30) + lVar9));
    lVar9 = lVar9 + 0x78;
  }
  iVar3 = (proto->nested_type_).super_RepeatedPtrFieldBase.current_size_;
  *(int *)(result + 0x38) = iVar3;
  AllocateArray<google::protobuf::Descriptor>(this,iVar3,(Descriptor **)(result + 0x40));
  lVar9 = 0;
  for (lVar12 = 0; lVar12 < (proto->nested_type_).super_RepeatedPtrFieldBase.current_size_;
      lVar12 = lVar12 + 1) {
    proto_00 = internal::RepeatedPtrFieldBase::
               Get<google::protobuf::RepeatedPtrField<google::protobuf::DescriptorProto>::TypeHandler>
                         (&(proto->nested_type_).super_RepeatedPtrFieldBase,(int)lVar12);
    BuildMessage(this,proto_00,result,(Descriptor *)(*(long *)(result + 0x40) + lVar9));
    lVar9 = lVar9 + 0x78;
  }
  iVar3 = (proto->enum_type_).super_RepeatedPtrFieldBase.current_size_;
  *(int *)(result + 0x48) = iVar3;
  AllocateArray<google::protobuf::EnumDescriptor>(this,iVar3,(EnumDescriptor **)(result + 0x50));
  lVar9 = 0;
  for (lVar12 = 0; lVar12 < (proto->enum_type_).super_RepeatedPtrFieldBase.current_size_;
      lVar12 = lVar12 + 1) {
    proto_01 = internal::RepeatedPtrFieldBase::
               Get<google::protobuf::RepeatedPtrField<google::protobuf::EnumDescriptorProto>::TypeHandler>
                         (&(proto->enum_type_).super_RepeatedPtrFieldBase,(int)lVar12);
    BuildEnum(this,proto_01,result,(EnumDescriptor *)(*(long *)(result + 0x50) + lVar9));
    lVar9 = lVar9 + 0x38;
  }
  iVar3 = (proto->extension_range_).super_RepeatedPtrFieldBase.current_size_;
  *(int *)(result + 0x58) = iVar3;
  output = result + 0x60;
  AllocateArray<google::protobuf::Descriptor::ExtensionRange>(this,iVar3,(ExtensionRange **)output);
  this_00 = &proto->extension_range_;
  lVar9 = 0;
  for (lVar12 = 0; lVar12 < (proto->extension_range_).super_RepeatedPtrFieldBase.current_size_;
      lVar12 = lVar12 + 1) {
    pTVar8 = internal::RepeatedPtrFieldBase::
             Get<google::protobuf::RepeatedPtrField<google::protobuf::DescriptorProto_ExtensionRange>::TypeHandler>
                       (&this_00->super_RepeatedPtrFieldBase,(int)lVar12);
    BuildExtensionRange(this,pTVar8,result,(ExtensionRange *)(*(long *)(result + 0x60) + lVar9));
    lVar9 = lVar9 + 8;
  }
  iVar3 = (proto->extension_).super_RepeatedPtrFieldBase.current_size_;
  *(int *)(result + 0x68) = iVar3;
  AllocateArray<google::protobuf::FieldDescriptor>(this,iVar3,(FieldDescriptor **)(result + 0x70));
  lVar9 = 0;
  for (lVar12 = 0; lVar12 < (proto->extension_).super_RepeatedPtrFieldBase.current_size_;
      lVar12 = lVar12 + 1) {
    pTVar7 = internal::RepeatedPtrFieldBase::
             Get<google::protobuf::RepeatedPtrField<google::protobuf::FieldDescriptorProto>::TypeHandler>
                       (&(proto->extension_).super_RepeatedPtrFieldBase,(int)lVar12);
    BuildExtension(this,pTVar7,result,(FieldDescriptor *)(*(long *)(result + 0x70) + lVar9));
    lVar9 = lVar9 + 0x78;
  }
  aVar13.descriptor = result;
  if ((proto->_has_bits_[0] & 0x40) == 0) {
    *(undefined8 *)(result + 0x20) = 0;
  }
  else {
    orig_options = proto->options_;
    if (orig_options == (MessageOptions *)0x0) {
      orig_options = *(MessageOptions **)(DescriptorProto::default_instance_ + 0x90);
    }
    AllocateOptions<google::protobuf::Descriptor>(this,orig_options,result);
  }
  symbol._4_4_ = uStack_23c;
  symbol.type = 1;
  symbol.field_1.descriptor = result;
  AddSymbol(this,*(string **)(result + 8),parent,*(string **)result,&proto->super_Message,symbol);
  for (lVar9 = 0; lVar9 < *(int *)(result + 0x2c); lVar9 = lVar9 + 1) {
    pFVar10 = *(FieldDescriptor **)pDVar4 + lVar9 * 0x78;
    for (lVar12 = 0; lVar12 < *(int *)(result + 0x58); lVar12 = lVar12 + 1) {
      pEVar1 = *(ExtensionRange **)output;
      if ((pEVar1[lVar12].start <= *(int *)(pFVar10 + 0x28)) &&
         (*(int *)(pFVar10 + 0x28) < pEVar1[lVar12].end)) {
        psVar5 = *(string **)(pFVar10 + 8);
        pTVar8 = internal::RepeatedPtrFieldBase::
                 Get<google::protobuf::RepeatedPtrField<google::protobuf::DescriptorProto_ExtensionRange>::TypeHandler>
                           (&this_00->super_RepeatedPtrFieldBase,(int)lVar12);
        strings::internal::SubstituteArg::SubstituteArg(&local_90,pEVar1[lVar12].start);
        strings::internal::SubstituteArg::SubstituteArg(&local_c0,pEVar1[lVar12].end + -1);
        local_f0.text_ = (char *)**(undefined8 **)pFVar10;
        local_f0.size_ = *(int *)(*(undefined8 **)pFVar10 + 1);
        strings::internal::SubstituteArg::SubstituteArg(&local_60,*(int *)(pFVar10 + 0x28));
        local_120.text_ = (char *)0x0;
        local_120.size_ = -1;
        local_150.text_ = (char *)0x0;
        local_150.size_ = -1;
        local_180.text_ = (char *)0x0;
        local_180.size_ = -1;
        local_1b0.text_ = (char *)0x0;
        local_1b0.size_ = -1;
        local_1e0.text_ = (char *)0x0;
        local_1e0.size_ = -1;
        local_210.text_ = (char *)0x0;
        local_210.size_ = -1;
        strings::Substitute_abi_cxx11_
                  (&local_230,(strings *)"Extension range $0 to $1 includes field \"$2\" ($3).",
                   (char *)&local_90,&local_c0,&local_f0,&local_60,&local_120,&local_150,&local_180,
                   &local_1b0,&local_1e0,&local_210,(SubstituteArg *)aVar13.descriptor);
        AddError(this,psVar5,&pTVar8->super_Message,NUMBER,&local_230);
        result = aVar13.descriptor;
        std::__cxx11::string::~string((string *)&local_230);
        aVar13.descriptor = result;
      }
    }
  }
  iVar3 = *(int *)(result + 0x58);
  pSVar11 = (SubstituteArg *)0x0;
  while ((long)pSVar11 < (long)iVar3) {
    pEVar1 = *(ExtensionRange **)output;
    arg9 = (SubstituteArg *)((long)&pSVar11->text_ + 1);
    for (lVar9 = local_258; (int)lVar9 < iVar3; lVar9 = lVar9 + 1) {
      pEVar2 = *(ExtensionRange **)output;
      if ((pEVar2[lVar9].start < pEVar1[(long)pSVar11].end) &&
         (pEVar1[(long)pSVar11].start < pEVar2[lVar9].end)) {
        psVar5 = *(string **)(result + 8);
        pTVar8 = internal::RepeatedPtrFieldBase::
                 Get<google::protobuf::RepeatedPtrField<google::protobuf::DescriptorProto_ExtensionRange>::TypeHandler>
                           (&this_00->super_RepeatedPtrFieldBase,(int)lVar9);
        strings::internal::SubstituteArg::SubstituteArg(&local_90,pEVar2[lVar9].start);
        strings::internal::SubstituteArg::SubstituteArg(&local_c0,pEVar2[lVar9].end + -1);
        strings::internal::SubstituteArg::SubstituteArg(&local_f0,pEVar1[(long)pSVar11].start);
        strings::internal::SubstituteArg::SubstituteArg(&local_60,pEVar1[(long)pSVar11].end + -1);
        local_120.text_ = (char *)0x0;
        local_120.size_ = -1;
        local_150.text_ = (char *)0x0;
        local_150.size_ = -1;
        local_180.text_ = (char *)0x0;
        local_180.size_ = -1;
        local_1b0.text_ = (char *)0x0;
        local_1b0.size_ = -1;
        local_1e0.text_ = (char *)0x0;
        local_1e0.size_ = -1;
        local_210.text_ = (char *)0x0;
        local_210.size_ = -1;
        strings::Substitute_abi_cxx11_
                  (&local_230,
                   (strings *)
                   "Extension range $0 to $1 overlaps with already-defined range $2 to $3.",
                   (char *)&local_90,&local_c0,&local_f0,&local_60,&local_120,&local_150,&local_180,
                   &local_1b0,&local_1e0,&local_210,arg9);
        AddError(this,psVar5,&pTVar8->super_Message,NUMBER,&local_230);
        std::__cxx11::string::~string((string *)&local_230);
        iVar3 = *(int *)(result + 0x58);
      }
    }
    local_258 = local_258 + 1;
    pSVar11 = arg9;
  }
  return;
}

Assistant:

void DescriptorBuilder::BuildMessage(const DescriptorProto& proto,
                                     const Descriptor* parent,
                                     Descriptor* result) {
  const string& scope = (parent == NULL) ?
    file_->package() : parent->full_name();
  string* full_name = tables_->AllocateString(scope);
  if (!full_name->empty()) full_name->append(1, '.');
  full_name->append(proto.name());

  ValidateSymbolName(proto.name(), *full_name, proto);

  result->name_            = tables_->AllocateString(proto.name());
  result->full_name_       = full_name;
  result->file_            = file_;
  result->containing_type_ = parent;
  result->is_placeholder_  = false;
  result->is_unqualified_placeholder_ = false;

  BUILD_ARRAY(proto, result, field          , BuildField         , result);
  BUILD_ARRAY(proto, result, nested_type    , BuildMessage       , result);
  BUILD_ARRAY(proto, result, enum_type      , BuildEnum          , result);
  BUILD_ARRAY(proto, result, extension_range, BuildExtensionRange, result);
  BUILD_ARRAY(proto, result, extension      , BuildExtension     , result);

  // Copy options.
  if (!proto.has_options()) {
    result->options_ = NULL;  // Will set to default_instance later.
  } else {
    AllocateOptions(proto.options(), result);
  }

  AddSymbol(result->full_name(), parent, result->name(),
            proto, Symbol(result));

  // Check that no fields have numbers in extension ranges.
  for (int i = 0; i < result->field_count(); i++) {
    const FieldDescriptor* field = result->field(i);
    for (int j = 0; j < result->extension_range_count(); j++) {
      const Descriptor::ExtensionRange* range = result->extension_range(j);
      if (range->start <= field->number() && field->number() < range->end) {
        AddError(field->full_name(), proto.extension_range(j),
                 DescriptorPool::ErrorCollector::NUMBER,
                 strings::Substitute(
                   "Extension range $0 to $1 includes field \"$2\" ($3).",
                   range->start, range->end - 1,
                   field->name(), field->number()));
      }
    }
  }

  // Check that extension ranges don't overlap.
  for (int i = 0; i < result->extension_range_count(); i++) {
    const Descriptor::ExtensionRange* range1 = result->extension_range(i);
    for (int j = i + 1; j < result->extension_range_count(); j++) {
      const Descriptor::ExtensionRange* range2 = result->extension_range(j);
      if (range1->end > range2->start && range2->end > range1->start) {
        AddError(result->full_name(), proto.extension_range(j),
                 DescriptorPool::ErrorCollector::NUMBER,
                 strings::Substitute("Extension range $0 to $1 overlaps with "
                                     "already-defined range $2 to $3.",
                                     range2->start, range2->end - 1,
                                     range1->start, range1->end - 1));
      }
    }
  }
}